

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.h
# Opt level: O2

void __thiscall jrtplib::RTPPacket::~RTPPacket(RTPPacket *this)

{
  RTPMemoryManager *in_RDX;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPPacket_00144b90;
  if (((jrtplib *)this->packet != (jrtplib *)0x0) && (this->externalbuffer == false)) {
    RTPDeleteByteArray((jrtplib *)this->packet,(uint8_t *)(this->super_RTPMemoryObject).mgr,in_RDX);
  }
  return;
}

Assistant:

virtual ~RTPPacket()																{ if (packet && !externalbuffer) RTPDeleteByteArray(packet,GetMemoryManager());  }